

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O2

UnitsPtr __thiscall
libcellml::modelsEquivalentUnits(libcellml *this,ModelPtr *model,UnitsPtr *units)

{
  bool bVar1;
  size_t sVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  ulong uVar4;
  UnitsPtr UVar5;
  
  uVar4 = 0;
  while( true ) {
    sVar2 = Model::unitsCount((model->
                              super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr);
    if (sVar2 <= uVar4) break;
    Model::units((Model *)this,
                 (size_t)(model->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr);
    bVar1 = Units::equivalent((UnitsPtr *)this,units);
    _Var3._M_pi = extraout_RDX_00;
    if (bVar1) goto LAB_001f0461;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8));
    uVar4 = uVar4 + 1;
  }
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  _Var3._M_pi = extraout_RDX;
LAB_001f0461:
  UVar5.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  UVar5.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (UnitsPtr)UVar5.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

UnitsPtr modelsEquivalentUnits(const ModelPtr &model, const UnitsPtr &units)
{
    for (size_t i = 0; i < model->unitsCount(); ++i) {
        const UnitsPtr u = model->units(i);
        if (Units::equivalent(u, units)) {
            return u;
        }
    }

    return nullptr;
}